

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v6::internal::bigint::subtract_aligned(bigint *this,bigint *other)

{
  bigit other_00;
  bigint *pbVar1;
  bigint *in_RSI;
  long in_RDI;
  size_t n;
  size_t j;
  int i;
  bigit borrow;
  bigint *this_00;
  int index;
  
  index = 0;
  other_00 = in_RSI->exp_ - *(int *)(in_RDI + 0xa0);
  this_00 = (bigint *)0x0;
  pbVar1 = (bigint *)buffer<unsigned_int>::size((buffer<unsigned_int> *)in_RSI);
  for (; this_00 != pbVar1;
      this_00 = (bigint *)((long)&(this_00->bigits_).super_buffer<unsigned_int>._vptr_buffer + 1)) {
    buffer<unsigned_int>::operator[]<unsigned_long>
              ((buffer<unsigned_int> *)in_RSI,(unsigned_long)this_00);
    subtract_bigits(in_RSI,index,other_00,(bigit *)this_00);
    other_00 = other_00 + 1;
  }
  while (index != 0) {
    subtract_bigits(in_RSI,index,other_00,(bigit *)this_00);
  }
  remove_leading_zeros(this_00);
  return;
}

Assistant:

void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j) {
      subtract_bigits(i, other.bigits_[j], borrow);
    }
    while (borrow > 0) subtract_bigits(i, 0, borrow);
    remove_leading_zeros();
  }